

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.hpp
# Opt level: O0

const_iterator __thiscall
ghc::filesystem::path::iterator::decrement(iterator *this,const_iterator *pos)

{
  bool bVar1;
  reference pcVar2;
  difference_type dVar3;
  undefined8 *in_RSI;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RDI;
  const_iterator i;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_ffffffffffffff98;
  uint7 in_stack_ffffffffffffffa0;
  undefined1 in_stack_ffffffffffffffa7;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_50;
  char *local_48;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __val;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd8;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_8;
  
  local_8._M_current = (char *)*in_RSI;
  bVar1 = __gnu_cxx::operator!=
                    ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                     in_stack_ffffffffffffff98);
  if (bVar1) {
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator--(&local_8);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                       in_stack_ffffffffffffff98);
    if ((bVar1) &&
       ((bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                            in_stack_ffffffffffffff98), bVar1 ||
        (pcVar2 = __gnu_cxx::
                  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator*(&local_8), *pcVar2 != '/')))) {
      __val._M_current = local_8._M_current;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&stack0xffffffffffffffd0,(iterator_type)local_8._M_current);
      local_48 = in_RDI->_M_current;
      std::
      reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::reverse_iterator(&local_40,(iterator_type)local_48);
      std::
      find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,char>
                ((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffd8._M_current,
                 (reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)in_stack_ffffffffffffffd0._M_current,__val._M_current);
      local_8._M_current =
           (char *)std::
                   reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::base((reverse_iterator<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&stack0xffffffffffffffd8);
      dVar3 = __gnu_cxx::operator-
                        ((__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)CONCAT17(in_stack_ffffffffffffffa7,in_stack_ffffffffffffffa0),
                         in_stack_ffffffffffffff98);
      bVar1 = false;
      if (dVar3 == 2) {
        pcVar2 = __gnu_cxx::
                 __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::operator*(in_RDI);
        bVar1 = false;
        if (*pcVar2 == '/') {
          local_50 = __gnu_cxx::
                     __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     ::operator+(in_RDI,(ulong)in_stack_ffffffffffffffa0);
          pcVar2 = __gnu_cxx::
                   __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ::operator*(&local_50);
          bVar1 = *pcVar2 == '/';
        }
      }
      if (bVar1) {
        __gnu_cxx::
        __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator-=(&local_8,2);
      }
    }
  }
  return (const_iterator)local_8._M_current;
}

Assistant:

GHC_INLINE path::impl_string_type::const_iterator path::iterator::decrement(const path::impl_string_type::const_iterator& pos) const
{
    path::impl_string_type::const_iterator i = pos;
    if (i != _first) {
        --i;
        // if this is now the root slash or the trailing slash, we are done,
        // else check for network name
        if (i != _root && (pos != _last || *i != preferred_separator)) {
#ifdef GHC_OS_WINDOWS
            static const impl_string_type seps = GHC_PLATFORM_LITERAL("\\:");
            i = std::find_first_of(std::reverse_iterator<path::impl_string_type::const_iterator>(i), std::reverse_iterator<path::impl_string_type::const_iterator>(_first), seps.begin(), seps.end()).base();
            if (i > _first && *i == ':') {
                i++;
            }
#else
            i = std::find(std::reverse_iterator<path::impl_string_type::const_iterator>(i), std::reverse_iterator<path::impl_string_type::const_iterator>(_first), preferred_separator).base();
#endif
            // Now we have to check if this is a network name
            if (i - _first == 2 && *_first == preferred_separator && *(_first + 1) == preferred_separator) {
                i -= 2;
            }
        }
    }
    return i;
}